

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

void __thiscall
slang::parsing::ParserBase::Window::insertHead
          (Window *this,span<const_slang::parsing::Token,_18446744073709551615UL> tokens)

{
  ulong uVar1;
  long lVar2;
  void *__dest;
  size_type sVar3;
  pointer pTVar4;
  long lVar5;
  long in_RDI;
  size_t existing;
  span<const_slang::parsing::Token,_18446744073709551615UL> local_10;
  
  uVar1 = *(ulong *)(in_RDI + 0x30);
  sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                    ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb1b0);
  if (uVar1 < sVar3) {
    lVar5 = *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30);
    lVar2 = *(long *)(in_RDI + 8);
    sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb24d);
    memmove((void *)(lVar2 + sVar3 * 0x10),
            (void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x30) * 0x10),lVar5 * 0x10);
    __dest = *(void **)(in_RDI + 8);
    pTVar4 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::data(&local_10);
    sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb2a4);
    memcpy(__dest,pTVar4,sVar3 << 4);
    *(undefined8 *)(in_RDI + 0x30) = 0;
    sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb2d1);
    *(size_type *)(in_RDI + 0x38) = sVar3 + lVar5;
  }
  else {
    sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb1c7);
    *(size_type *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) - sVar3;
    lVar2 = *(long *)(in_RDI + 8);
    lVar5 = *(long *)(in_RDI + 0x30);
    pTVar4 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::data(&local_10);
    sVar3 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x6fb207);
    memcpy((void *)(lVar2 + lVar5 * 0x10),pTVar4,sVar3 << 4);
  }
  return;
}

Assistant:

void ParserBase::Window::insertHead(std::span<const Token> tokens) {
    if (currentOffset >= tokens.size()) {
        currentOffset -= tokens.size();
        memcpy(buffer + currentOffset, tokens.data(), tokens.size() * sizeof(Token));
        return;
    }

    size_t existing = count - currentOffset;
    SLANG_ASSERT(tokens.size() + existing < capacity);

    memmove(buffer + tokens.size(), buffer + currentOffset, existing * sizeof(Token));
    memcpy(buffer, tokens.data(), tokens.size() * sizeof(Token));

    currentOffset = 0;
    count = tokens.size() + existing;
}